

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O2

duckdb_state
duckdb_register_aggregate_function(duckdb_connection connection,duckdb_aggregate_function function)

{
  duckdb_state dVar1;
  string local_1a0;
  AggregateFunctionSet set;
  AggregateFunction local_148;
  
  if (function == (duckdb_aggregate_function)0x0 || connection == (duckdb_connection)0x0) {
    dVar1 = DuckDBError;
  }
  else {
    std::__cxx11::string::string((string *)&local_1a0,(string *)(function + 8));
    duckdb::AggregateFunctionSet::AggregateFunctionSet(&set,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    duckdb::AggregateFunction::AggregateFunction(&local_148,(AggregateFunction *)function);
    std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
    emplace_back<duckdb::AggregateFunction>
              (&set.super_FunctionSet<duckdb::AggregateFunction>.functions.
                super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
               &local_148);
    duckdb::AggregateFunction::~AggregateFunction(&local_148);
    dVar1 = duckdb_register_aggregate_function_set(connection,(duckdb_aggregate_function_set)&set);
    duckdb::FunctionSet<duckdb::AggregateFunction>::~FunctionSet
              (&set.super_FunctionSet<duckdb::AggregateFunction>);
  }
  return dVar1;
}

Assistant:

duckdb_state duckdb_register_aggregate_function(duckdb_connection connection, duckdb_aggregate_function function) {
	if (!connection || !function) {
		return DuckDBError;
	}

	auto &aggregate_function = GetCAggregateFunction(function);
	duckdb::AggregateFunctionSet set(aggregate_function.name);
	set.AddFunction(aggregate_function);
	return duckdb_register_aggregate_function_set(connection, reinterpret_cast<duckdb_aggregate_function_set>(&set));
}